

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_render.h
# Opt level: O3

void embree::renderBenchFunc<embree::Tutorial>
               (BenchState *state,BenchParams *params,int argc,char **argv)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ostream *poVar9;
  int64_t iVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar33;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  fmtflags __old;
  ISPCCamera ispccamera;
  Tutorial tutorial;
  double local_440;
  FilteredStatistics local_428;
  BenchParams *local_3e8;
  uint local_3dc;
  undefined8 local_3d8;
  FilteredStatistics local_3d0;
  ISPCCamera local_38c;
  TutorialApplication local_358;
  
  local_3e8 = params;
  Tutorial::Tutorial((Tutorial *)&local_358);
  local_358.interactive = false;
  TutorialApplication::main(&local_358,argc,argv);
  TutorialApplication::resize(&local_358,local_358.width,local_358.height);
  Camera::getISPCCamera(&local_38c,&local_358.camera,(ulong)local_358.width,(ulong)local_358.height)
  ;
  lVar2 = *(long *)(std::cout + -0x18);
  uVar1 = *(uint *)(operator_delete__ + lVar2);
  local_3d8 = *(undefined8 *)(&std::bad_alloc::typeinfo + lVar2);
  *(uint *)(operator_delete__ + lVar2) = uVar1 & 0xfffffefb | 4;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 4;
  local_428.fskip_small = 0.5;
  local_428.fskip_large = 0.0;
  local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _12_8_ = 0;
  local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_428.stat.v._0_4_ = 0;
  local_428.stat.v._4_4_ = 0;
  local_428.stat.v2 = 0.0;
  local_428.stat.vmin = INFINITY;
  local_428.stat.vmax = -INFINITY;
  uVar11 = 0;
  local_428.stat.N = 0;
  local_3d0.fskip_small = 0.5;
  local_3d0.fskip_large = 0.0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _12_8_ = 0;
  local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_3d0.stat.v._0_4_ = 0;
  local_3d0.stat.v._4_4_ = 0;
  local_3d0.stat.v2 = 0.0;
  local_3d0.stat.vmin = INFINITY;
  local_3d0.stat.vmax = -INFINITY;
  local_3d0.stat.N = 0;
  local_3dc = local_3e8->minTimeOrIterations + local_3e8->skipIterations;
  uVar13 = (ulong)(int)local_3dc;
  if (local_3e8->skipIterations != 0) {
    uVar12 = 0;
    do {
      TutorialApplication::initRayStats(&local_358);
      dVar15 = getSeconds();
      TutorialApplication::render
                (&local_358,local_358.pixels,local_358.width,local_358.height,0.0,&local_38c);
      dVar16 = getSeconds();
      local_440 = (double)local_38c.render_time;
      if ((local_38c.render_time == 0.0) && (!NAN(local_38c.render_time))) {
        local_440 = dVar16 - dVar15;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"frame [",7);
      *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 3;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
      *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 3;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
      *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
      poVar9 = std::ostream::_M_insert<double>(1.0 / local_440);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps (skipped)",0xe);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::ostream::flush();
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)local_3e8->skipIterations;
    } while (uVar12 < uVar11);
  }
  if (uVar11 < uVar13) {
    do {
      TutorialApplication::initRayStats(&local_358);
      dVar15 = getSeconds();
      TutorialApplication::render
                (&local_358,local_358.pixels,local_358.width,local_358.height,0.0,&local_38c);
      dVar16 = getSeconds();
      local_440 = (double)local_38c.render_time;
      if ((local_38c.render_time == 0.0) && (!NAN(local_38c.render_time))) {
        local_440 = dVar16 - dVar15;
      }
      FilteredStatistics::add(&local_428,(float)(1.0 / local_440));
      iVar10 = TutorialApplication::getNumRays(&local_358);
      FilteredStatistics::add(&local_3d0,(float)((double)iVar10 / (local_440 * 1000000.0)));
      if ((0x3ff < local_3dc) && ((uVar11 & 0x3f) == 0)) {
        auVar36._8_4_ = (int)(local_428.stat.N >> 0x20);
        auVar36._0_8_ = local_428.stat.N;
        auVar36._12_4_ = 0x45300000;
        dVar16 = (auVar36._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0);
        dVar15 = (double)CONCAT44(local_428.stat.v._4_4_,local_428.stat.v._0_4_) / dVar16;
        fVar14 = 0.0;
        if (local_428.stat.N != 0) {
          fVar14 = (float)dVar15;
        }
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          if (local_428.stat.N == 0) {
            fVar34 = 0.0;
          }
          else {
            dVar15 = local_428.stat.v2 / dVar16 - dVar15 * dVar15;
            if (dVar15 <= 0.0) {
              dVar15 = 0.0;
            }
            fVar34 = (float)SQRT(dVar15) * 100.0;
          }
          dVar15 = (double)(fVar34 / fVar14);
        }
        else {
          dVar15 = 0.0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"frame [",7);
        *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 3;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 3;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
        poVar9 = std::ostream::_M_insert<double>((double)(float)(1.0 / local_440));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"min = ",6);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
        poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmin);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"avg = ",6);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
        auVar35._8_4_ = (int)(local_428.stat.N >> 0x20);
        auVar35._0_8_ = local_428.stat.N;
        auVar35._12_4_ = 0x45300000;
        dVar16 = 0.0;
        if (local_428.stat.N != 0) {
          dVar16 = (double)(float)((double)CONCAT44(local_428.stat.v._4_4_,local_428.stat.v._0_4_) /
                                  ((auVar35._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)local_428.stat.N) -
                                  4503599627370496.0)));
        }
        poVar9 = std::ostream::_M_insert<double>(dVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max = ",6);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
        poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmax);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"sigma = ",8);
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 6;
        if (local_428.stat.N == 0) {
          dVar16 = 0.0;
        }
        else {
          auVar17._8_4_ = (int)(local_428.stat.N >> 0x20);
          auVar17._0_8_ = local_428.stat.N;
          auVar17._12_4_ = 0x45300000;
          dVar16 = (double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0;
          dVar33 = auVar17._8_8_ - 1.9342813113834067e+25;
          auVar3._4_4_ = local_428.stat.v._4_4_;
          auVar3._0_4_ = local_428.stat.v._0_4_;
          auVar3._8_8_ = local_428.stat.v2;
          auVar18._0_8_ = dVar16 + dVar33;
          auVar18._8_8_ = dVar16 + dVar33;
          auVar36 = divpd(auVar3,auVar18);
          dVar16 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
          if (dVar16 <= 0.0) {
            dVar16 = 0.0;
          }
          dVar16 = (double)(float)SQRT(dVar16);
        }
        poVar9 = std::ostream::_M_insert<double>(dVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
        poVar9 = std::ostream::_M_insert<double>(dVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%)",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  auVar19._8_4_ = (int)(local_428.stat.N >> 0x20);
  auVar19._0_8_ = local_428.stat.N;
  auVar19._12_4_ = 0x45300000;
  dVar16 = (auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0);
  dVar15 = (double)CONCAT44(local_428.stat.v._4_4_,local_428.stat.v._0_4_) / dVar16;
  fVar14 = 0.0;
  if (local_428.stat.N != 0) {
    fVar14 = (float)dVar15;
  }
  if ((fVar14 != 0.0) || (NAN(fVar14))) {
    if (local_428.stat.N == 0) {
      fVar34 = 0.0;
    }
    else {
      dVar15 = local_428.stat.v2 / dVar16 - dVar15 * dVar15;
      if (dVar15 <= 0.0) {
        dVar15 = 0.0;
      }
      fVar34 = ((float)SQRT(dVar15) / SQRT((float)local_428.stat.N)) * 100.0;
    }
    dVar15 = (double)(fVar34 / fVar14);
  }
  else {
    dVar15 = 0.0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"frame [",7);
  *(undefined8 *)(__cxa_call_unexpected + *(long *)(std::cout + -0x18)) = 3;
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_3e8->skipIterations);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," - ",3);
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 3;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"              ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"min = ",6);
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
  poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"avg = ",6);
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
  dVar16 = 0.0;
  if (local_428.stat.N != 0) {
    auVar20._8_4_ = (int)(local_428.stat.N >> 0x20);
    auVar20._0_8_ = local_428.stat.N;
    auVar20._12_4_ = 0x45300000;
    dVar16 = (double)(float)((double)CONCAT44(local_428.stat.v._4_4_,local_428.stat.v._0_4_) /
                            ((auVar20._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0
                            )));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"max = ",6);
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 8;
  poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmax);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," fps, ",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"sigma = ",8);
  *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 6;
  if (local_428.stat.N == 0) {
    dVar16 = 0.0;
  }
  else {
    auVar21._8_4_ = (int)(local_428.stat.N >> 0x20);
    auVar21._0_8_ = local_428.stat.N;
    auVar21._12_4_ = 0x45300000;
    dVar16 = (double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0;
    dVar33 = auVar21._8_8_ - 1.9342813113834067e+25;
    auVar4._4_4_ = local_428.stat.v._4_4_;
    auVar4._0_4_ = local_428.stat.v._0_4_;
    auVar4._8_8_ = local_428.stat.v2;
    auVar22._0_8_ = dVar16 + dVar33;
    auVar22._8_8_ = dVar16 + dVar33;
    auVar36 = divpd(auVar4,auVar22);
    dVar16 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
    if (dVar16 <= 0.0) {
      dVar16 = 0.0;
    }
    dVar16 = (double)((float)SQRT(dVar16) / SQRT((float)local_428.stat.N));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," (",2);
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%)",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MIN ",0x15);
  poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmin);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_AVG ",0x15);
  dVar15 = 0.0;
  if (local_428.stat.N != 0) {
    auVar23._8_4_ = (int)(local_428.stat.N >> 0x20);
    auVar23._0_8_ = local_428.stat.N;
    auVar23._12_4_ = 0x45300000;
    dVar15 = (double)(float)((double)CONCAT44(local_428.stat.v._4_4_,local_428.stat.v._0_4_) /
                            ((auVar23._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0
                            )));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MAX ",0x15);
  poVar9 = std::ostream::_M_insert<double>((double)local_428.stat.vmax);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_SIGMA ",0x17);
  if (local_428.stat.N == 0) {
    dVar15 = 0.0;
  }
  else {
    auVar24._8_4_ = (int)(local_428.stat.N >> 0x20);
    auVar24._0_8_ = local_428.stat.N;
    auVar24._12_4_ = 0x45300000;
    dVar15 = (double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0;
    dVar16 = auVar24._8_8_ - 1.9342813113834067e+25;
    auVar5._4_4_ = local_428.stat.v._4_4_;
    auVar5._0_4_ = local_428.stat.v._0_4_;
    auVar5._8_8_ = local_428.stat.v2;
    auVar25._0_8_ = dVar15 + dVar16;
    auVar25._8_8_ = dVar15 + dVar16;
    auVar36 = divpd(auVar5,auVar25);
    dVar15 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
    if (dVar15 <= 0.0) {
      dVar15 = 0.0;
    }
    dVar15 = (double)(float)SQRT(dVar15);
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_AVG_SIGMA ",0x1b);
  if (local_428.stat.N == 0) {
    dVar15 = 0.0;
  }
  else {
    auVar26._8_4_ = (int)(local_428.stat.N >> 0x20);
    auVar26._0_8_ = local_428.stat.N;
    auVar26._12_4_ = 0x45300000;
    dVar15 = (double)CONCAT44(0x43300000,(int)local_428.stat.N) - 4503599627370496.0;
    dVar16 = auVar26._8_8_ - 1.9342813113834067e+25;
    auVar6._4_4_ = local_428.stat.v._4_4_;
    auVar6._0_4_ = local_428.stat.v._0_4_;
    auVar6._8_8_ = local_428.stat.v2;
    auVar27._0_8_ = dVar15 + dVar16;
    auVar27._8_8_ = dVar15 + dVar16;
    auVar36 = divpd(auVar6,auVar27);
    dVar15 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
    if (dVar15 <= 0.0) {
      dVar15 = 0.0;
    }
    dVar15 = (double)((float)SQRT(dVar15) / SQRT((float)local_428.stat.N));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MIN ",0x1c);
  poVar9 = std::ostream::_M_insert<double>((double)local_3d0.stat.vmin);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG ",0x1c);
  dVar15 = 0.0;
  if (local_3d0.stat.N != 0) {
    auVar28._8_4_ = (int)(local_3d0.stat.N >> 0x20);
    auVar28._0_8_ = local_3d0.stat.N;
    auVar28._12_4_ = 0x45300000;
    dVar15 = (double)(float)((double)CONCAT44(local_3d0.stat.v._4_4_,local_3d0.stat.v._0_4_) /
                            ((auVar28._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_3d0.stat.N) - 4503599627370496.0
                            )));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_MAX ",0x1c);
  poVar9 = std::ostream::_M_insert<double>((double)local_3d0.stat.vmax);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_SIGMA ",0x1e);
  if (local_3d0.stat.N == 0) {
    dVar15 = 0.0;
  }
  else {
    auVar29._8_4_ = (int)(local_3d0.stat.N >> 0x20);
    auVar29._0_8_ = local_3d0.stat.N;
    auVar29._12_4_ = 0x45300000;
    dVar15 = (double)CONCAT44(0x43300000,(int)local_3d0.stat.N) - 4503599627370496.0;
    dVar16 = auVar29._8_8_ - 1.9342813113834067e+25;
    auVar7._4_4_ = local_3d0.stat.v._4_4_;
    auVar7._0_4_ = local_3d0.stat.v._0_4_;
    auVar7._8_8_ = local_3d0.stat.v2;
    auVar30._0_8_ = dVar15 + dVar16;
    auVar30._8_8_ = dVar15 + dVar16;
    auVar36 = divpd(auVar7,auVar30);
    dVar15 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
    if (dVar15 <= 0.0) {
      dVar15 = 0.0;
    }
    dVar15 = (double)(float)SQRT(dVar15);
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"BENCHMARK_RENDER_MRAYPS_AVG_SIGMA ",0x22);
  if (local_3d0.stat.N == 0) {
    dVar15 = 0.0;
  }
  else {
    auVar31._8_4_ = (int)(local_3d0.stat.N >> 0x20);
    auVar31._0_8_ = local_3d0.stat.N;
    auVar31._12_4_ = 0x45300000;
    dVar15 = (double)CONCAT44(0x43300000,(int)local_3d0.stat.N) - 4503599627370496.0;
    dVar16 = auVar31._8_8_ - 1.9342813113834067e+25;
    auVar8._4_4_ = local_3d0.stat.v._4_4_;
    auVar8._0_4_ = local_3d0.stat.v._0_4_;
    auVar8._8_8_ = local_3d0.stat.v2;
    auVar32._0_8_ = dVar15 + dVar16;
    auVar32._8_8_ = dVar15 + dVar16;
    auVar36 = divpd(auVar8,auVar32);
    dVar15 = auVar36._8_8_ - auVar36._0_8_ * auVar36._0_8_;
    if (dVar15 <= 0.0) {
      dVar15 = 0.0;
    }
    dVar15 = (double)((float)SQRT(dVar15) / SQRT((float)local_3d0.stat.N));
  }
  poVar9 = std::ostream::_M_insert<double>(dVar15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ostream::flush();
  if ((void *)CONCAT44(local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_3d0.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_3d0.v.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_3d0.v.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_428.v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_428.v.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_428.v.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  *(uint *)(operator_delete__ + *(long *)(std::cout + -0x18)) = uVar1;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = local_3d8;
  TutorialApplication::~TutorialApplication(&local_358);
  return;
}

Assistant:

static void renderBenchFunc(BenchState& state, BenchParams& params ,int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
    return;
  }

  Tutorial tutorial;
  tutorial.interactive = false;
  tutorial.main(argc,argv);

  tutorial.resize(tutorial.width, tutorial.height);
  ISPCCamera ispccamera = tutorial.camera.getISPCCamera(tutorial.width, tutorial.height);

  for (size_t i = 0; i < params.skipIterations; i++)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
  }

  size_t numRays = 0;
  for (auto _ : *state.state)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
    numRays += tutorial.getNumRays();
  }

  state.state->SetItemsProcessed(state.state->iterations());
  state.state->counters["Rays/s"] = benchmark::Counter(numRays, benchmark::Counter::kIsRate);
#else
  renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
#endif
}